

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<long_double>::AddKel
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  int64_t iVar1;
  long lVar2;
  int64_t iVar3;
  int iVar4;
  longdouble *plVar5;
  long lVar6;
  long lVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar8;
  longdouble local_68;
  long local_50;
  long local_48;
  TPZFMatrix<long_double> *local_40;
  long local_38;
  
  lVar6 = source->fNElements;
  local_40 = elmat;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_48 = 0;
  if (0 < lVar6) {
    local_48 = lVar6;
  }
  local_38 = lVar6;
  if (iVar4 == 0) {
    for (local_50 = 0; local_50 != local_48; local_50 = local_50 + 1) {
      lVar6 = destinationindex->fStore[local_50];
      iVar1 = source->fStore[local_50];
      for (lVar7 = 0; local_38 != lVar7; lVar7 = lVar7 + 1) {
        lVar2 = destinationindex->fStore[lVar7];
        iVar3 = source->fStore[lVar7];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar2);
        local_68 = in_ST0;
        plVar5 = TPZFMatrix<long_double>::operator()(local_40,iVar1,iVar3);
        local_68 = local_68 + *plVar5;
        lVar8 = in_ST6;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar2,&local_68);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar8;
      }
    }
  }
  else {
    lVar6 = 0;
    while (lVar6 != local_48) {
      lVar7 = destinationindex->fStore[lVar6];
      iVar1 = source->fStore[lVar6];
      local_50 = lVar6;
      for (; local_38 != lVar6; lVar6 = lVar6 + 1) {
        lVar2 = destinationindex->fStore[lVar6];
        iVar3 = source->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar2);
        local_68 = in_ST0;
        plVar5 = TPZFMatrix<long_double>::operator()(local_40,iVar1,iVar3);
        local_68 = local_68 + *plVar5;
        lVar8 = in_ST6;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar2,&local_68);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar8;
      }
      lVar6 = local_50 + 1;
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}